

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cplusplus_pair.cc
# Opt level: O2

int main(int argc,char **argv)

{
  nng_err nVar1;
  ostream *poVar2;
  undefined8 *puVar3;
  char *pcVar4;
  int local_30 [2];
  char buf [8];
  size_t sz;
  nng_socket s1;
  nng_socket s2;
  
  nng_init((nng_init_params *)0x0);
  nVar1 = nng_pair1_open((nng_socket *)&sz);
  if (nVar1 == NNG_OK) {
    nVar1 = nng_pair1_open((nng_socket *)((long)&sz + 4));
    if (nVar1 == NNG_OK) {
      nVar1 = nng_listen(sz._0_4_,"inproc://c++",(nng_listener *)0x0,0);
      if (nVar1 == NNG_OK) {
        nVar1 = nng_dial(sz._4_4_,"inproc://c++",(nng_dialer *)0x0,0);
        if (nVar1 == NNG_OK) {
          nVar1 = nng_send(sz._4_4_,"ABC",4,0);
          if (nVar1 == NNG_OK) {
            buf[0] = '\b';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            nVar1 = nng_recv(sz._0_4_,local_30,(size_t *)buf,0);
            if (nVar1 == NNG_OK) {
              if ((buf != (char  [8])0x4) || (local_30[0] != 0x434241)) {
LAB_00108a13:
                puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar3 = "Contents did not match";
                goto LAB_00108b3b;
              }
              nVar1 = nng_send(sz._0_4_,"DEF",4,0);
              if (nVar1 == NNG_OK) {
                buf[0] = '\b';
                buf[1] = '\0';
                buf[2] = '\0';
                buf[3] = '\0';
                buf[4] = '\0';
                buf[5] = '\0';
                buf[6] = '\0';
                buf[7] = '\0';
                nVar1 = nng_recv(sz._4_4_,local_30,(size_t *)buf,0);
                if (nVar1 == NNG_OK) {
                  if ((buf != (char  [8])0x4) || (local_30[0] != 0x464544)) goto LAB_00108a13;
                  nVar1 = nng_socket_close(sz._0_4_);
                  if (nVar1 == NNG_OK) {
                    nVar1 = nng_socket_close(sz._4_4_);
                    if (nVar1 == NNG_OK) {
                      poVar2 = std::operator<<((ostream *)&std::cout,"Pass.");
                      std::endl<char,std::char_traits<char>>(poVar2);
                      nng_fini();
                      return 0;
                    }
                    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                    pcVar4 = nng_strerror(nVar1);
                  }
                  else {
                    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                    pcVar4 = nng_strerror(nVar1);
                  }
                }
                else {
                  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                  pcVar4 = nng_strerror(nVar1);
                }
              }
              else {
                puVar3 = (undefined8 *)__cxa_allocate_exception(8);
                pcVar4 = nng_strerror(nVar1);
              }
            }
            else {
              puVar3 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar4 = nng_strerror(nVar1);
            }
          }
          else {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            pcVar4 = nng_strerror(nVar1);
          }
        }
        else {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          pcVar4 = nng_strerror(nVar1);
        }
      }
      else {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = nng_strerror(nVar1);
      }
    }
    else {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      pcVar4 = nng_strerror(nVar1);
    }
  }
  else {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar4 = nng_strerror(nVar1);
  }
  *puVar3 = pcVar4;
LAB_00108b3b:
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

int
main(int argc, char **argv)
{

#if defined(NNG_HAVE_PAIR1)

	nng_socket s1;
	nng_socket s2;
	nng_err    rv;
	size_t     sz;
	char       buf[8];
	(void) argc;
	(void) argv;

	nng_init(NULL);
	if ((rv = (nng_err) nng_pair1_open(&s1)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_pair1_open(&s2)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_listen(s1, SOCKET_ADDRESS, NULL, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_dial(s2, SOCKET_ADDRESS, NULL, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_send(s2, (void *) "ABC", 4, 0)) != 0) {
		throw nng_strerror(rv);
	}
	sz = sizeof(buf);
	if ((rv = (nng_err) nng_recv(s1, buf, &sz, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((sz != 4) || (std::strcmp(buf, "ABC") != 0)) {
		throw "Contents did not match";
	}
	if ((rv = (nng_err) nng_send(s1, (void *) "DEF", 4, 0)) != 0) {
		throw nng_strerror(rv);
	}
	sz = sizeof(buf);
	if ((rv = (nng_err) nng_recv(s2, buf, &sz, 0)) != 0) {
		throw nng_strerror(rv);
	}
	if ((sz != 4) || (std::strcmp(buf, "DEF") != 0)) {
		throw "Contents did not match";
	}
	if ((rv = (nng_err) nng_socket_close(s1)) != 0) {
		throw nng_strerror(rv);
	}
	if ((rv = (nng_err) nng_socket_close(s2)) != 0) {
		throw nng_strerror(rv);
	}

	std::cout << "Pass." << std::endl;
	nng_fini();
#else
	(void) argc;
	(void) argv;
	std::cout << "Skipped (protocol unconfigured)." << std::endl;
#endif

	return (0);
}